

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

size_t intersection_uint32_card(uint32_t *A,size_t lenA,uint32_t *B,size_t lenB)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  size_t sVar4;
  
  if (lenB == 0 || lenA == 0) {
    sVar4 = 0;
  }
  else {
    puVar1 = A + lenA;
    puVar2 = B + lenB;
    sVar4 = 0;
    do {
      while (uVar3 = *A, *B <= uVar3) {
        while (*B < uVar3) {
          B = B + 1;
          if (B == puVar2) {
            return sVar4;
          }
        }
        if (uVar3 != *B) break;
        sVar4 = sVar4 + 1;
        A = A + 1;
        if (A == puVar1) {
          return sVar4;
        }
        B = B + 1;
        if (B == puVar2) {
          return sVar4;
        }
      }
      A = A + 1;
    } while (A != puVar1);
  }
  return sVar4;
}

Assistant:

size_t intersection_uint32_card(const uint32_t *A, const size_t lenA,
                                const uint32_t *B, const size_t lenB) {
    if (lenA == 0 || lenB == 0) return 0;
    size_t card = 0;
    const uint32_t *endA = A + lenA;
    const uint32_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return card;
        }
        while (*A > *B) {
            if (++B == endB) return card;
        }
        if (*A == *B) {
            card++;
            if (++A == endA || ++B == endB) return card;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return card;  // NOTREACHED
}